

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerConnection.cxx
# Opt level: O0

string * __thiscall
cmServerBufferStrategy::BufferMessage
          (string *__return_storage_ptr__,cmServerBufferStrategy *this,string *RawReadBuffer)

{
  size_type sVar1;
  __type _Var2;
  char *pcVar3;
  int local_a4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  undefined8 local_80;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  undefined8 local_70;
  ulong local_68;
  size_type ls;
  string line;
  allocator<char> local_29;
  long local_28;
  size_type needle;
  string *RawReadBuffer_local;
  cmServerBufferStrategy *this_local;
  string *rtn;
  
  needle = (size_type)RawReadBuffer;
  RawReadBuffer_local = (string *)this;
  this_local = (cmServerBufferStrategy *)__return_storage_ptr__;
  do {
    local_28 = std::__cxx11::string::find((char)needle,10);
    if (local_28 == -1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_29);
      std::allocator<char>::~allocator(&local_29);
      return __return_storage_ptr__;
    }
    std::__cxx11::string::substr((ulong)&ls,needle);
    local_68 = std::__cxx11::string::size();
    if ((1 < local_68) && (pcVar3 = (char *)std::__cxx11::string::at((ulong)&ls), *pcVar3 == '\r'))
    {
      std::__cxx11::string::erase((ulong)&ls,local_68 - 1);
    }
    sVar1 = needle;
    local_78._M_current = (char *)std::__cxx11::string::begin();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_70,&local_78);
    local_98._M_current = (char *)std::__cxx11::string::begin();
    local_90 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator+(&local_98,local_28);
    local_88 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator+(&local_90,1);
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_80,&local_88);
    std::__cxx11::string::erase(sVar1,local_70,local_80);
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ls
                            ,&kSTART_MAGIC_abi_cxx11_);
    if (_Var2) {
      std::__cxx11::string::clear();
      local_a4 = 3;
    }
    else {
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &ls,&kEND_MAGIC_abi_cxx11_);
      if (_Var2) {
        std::__cxx11::string::string((string *)__return_storage_ptr__);
        std::__cxx11::string::swap((string *)__return_storage_ptr__);
        local_a4 = 1;
      }
      else {
        std::__cxx11::string::operator+=((string *)&this->RequestBuffer,(string *)&ls);
        std::__cxx11::string::operator+=((string *)&this->RequestBuffer,"\n");
        local_a4 = 0;
      }
    }
    std::__cxx11::string::~string((string *)&ls);
  } while ((local_a4 == 0) || (local_a4 != 1));
  return __return_storage_ptr__;
}

Assistant:

std::string cmServerBufferStrategy::BufferMessage(std::string& RawReadBuffer)
{
  for (;;) {
    auto needle = RawReadBuffer.find('\n');

    if (needle == std::string::npos) {
      return "";
    }
    std::string line = RawReadBuffer.substr(0, needle);
    const auto ls = line.size();
    if (ls > 1 && line.at(ls - 1) == '\r') {
      line.erase(ls - 1, 1);
    }
    RawReadBuffer.erase(RawReadBuffer.begin(),
                        RawReadBuffer.begin() + static_cast<long>(needle) + 1);
    if (line == kSTART_MAGIC) {
      RequestBuffer.clear();
      continue;
    }
    if (line == kEND_MAGIC) {
      std::string rtn;
      rtn.swap(this->RequestBuffer);
      return rtn;
    }

    this->RequestBuffer += line;
    this->RequestBuffer += "\n";
  }
}